

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_arrayviewlist_fillpage(_garray *x,t_float fPage,t_float fTopItem)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int size;
  t_word *data;
  int local_34;
  t_word *local_30;
  
  local_34 = 0;
  local_30 = (t_word *)0x0;
  iVar4 = garray_getfloatwords(x,&local_34,&local_30);
  iVar3 = local_34;
  if (iVar4 != 0) {
    iVar2 = local_34 + -1 >> 0x1f;
    iVar4 = (local_34 + -1) / 1000 + iVar2;
    uVar5 = iVar4 - iVar2;
    uVar1 = (int)fPage;
    if ((int)uVar5 < (int)fPage) {
      uVar1 = uVar5;
    }
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    pdgui_vmess("::dialog_array::listview_setpage","s iii",x->x_realname->s_name,(ulong)uVar1,
                (ulong)((iVar4 - iVar2) + 1),1000);
    uVar5 = uVar1 * 1000;
    uVar6 = (ulong)(iVar3 + uVar1 * -1000);
    if ((int)(uVar5 + 1000) <= iVar3) {
      uVar6 = 1000;
    }
    pdgui_vmess("::dialog_array::listview_setdata","siw",x->x_realname->s_name,(ulong)uVar5,uVar6,
                local_30 + uVar5);
    pdgui_vmess("::dialog_array::listview_focus","si",x->x_realname->s_name,
                (ulong)(uint)(int)fTopItem);
    return;
  }
  pd_error(x,"error in %s()","garray_arrayviewlist_fillpage");
  return;
}

Assistant:

static void garray_arrayviewlist_fillpage(t_garray *x,
                                   t_float fPage,
                                   t_float fTopItem)
{
    int i, size=0, topItem=(int)fTopItem;
    int pagesize=ARRAYPAGESIZE, page=(int)fPage, maxpage;
    int offset, length;
    t_word *data=0;

    if(!garray_getfloatwords(x, &size, &data)) {
        pd_error(x, "error in %s()", __FUNCTION__);
        return;
    }

        /* make sure the requested page is within range */
    maxpage = (size - 1) / pagesize;
    if(page > maxpage)
        page = maxpage;
    if(page < 0)
        page = 0;

    pdgui_vmess("::dialog_array::listview_setpage", "s iii",
        x->x_realname->s_name,
        page, maxpage+1, pagesize);

    offset = page*pagesize;
    length = ((offset+pagesize) > size)?size-offset:pagesize;

    pdgui_vmess("::dialog_array::listview_setdata", "siw",
             x->x_realname->s_name,
             offset,
             length, data + offset);

    pdgui_vmess("::dialog_array::listview_focus", "si",
             x->x_realname->s_name,
             topItem);
}